

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ScaleWindow(ImGuiWindow_conflict *window,float scale)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  
  fVar1 = (window->Viewport->super_ImGuiViewport).Pos.x;
  fVar2 = (window->Viewport->super_ImGuiViewport).Pos.y;
  IVar3.y = (float)(int)(((window->Pos).y - fVar2) * scale + fVar2);
  IVar3.x = (float)(int)(((window->Pos).x - fVar1) * scale + fVar1);
  window->Pos = IVar3;
  IVar4.y = (float)(int)((window->Size).y * scale);
  IVar4.x = (float)(int)((window->Size).x * scale);
  window->Size = IVar4;
  IVar5.y = (float)(int)((window->SizeFull).y * scale);
  IVar5.x = (float)(int)((window->SizeFull).x * scale);
  window->SizeFull = IVar5;
  IVar6.y = (float)(int)(scale * (window->ContentSize).y);
  IVar6.x = (float)(int)((window->ContentSize).x * scale);
  window->ContentSize = IVar6;
  return;
}

Assistant:

static void ScaleWindow(ImGuiWindow* window, float scale)
{
    ImVec2 origin = window->Viewport->Pos;
    window->Pos = ImFloor((window->Pos - origin) * scale + origin);
    window->Size = ImFloor(window->Size * scale);
    window->SizeFull = ImFloor(window->SizeFull * scale);
    window->ContentSize = ImFloor(window->ContentSize * scale);
}